

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::handleSignal(int sig)

{
  long *plVar1;
  size_t sVar2;
  long lVar3;
  char *__s;
  bool bVar4;
  
  __s = "<unknown signal>";
  lVar3 = 8;
  do {
    if (*(int *)((long)&PTR_registerTranslator_0019cda8 + lVar3) == sig) {
      __s = *(char **)((long)&signalDefs + lVar3);
      break;
    }
    bVar4 = lVar3 != 0x58;
    lVar3 = lVar3 + 0x10;
  } while (bVar4);
  restorePreviousSignalHandlers();
  if (IMutableContext::currentContext == (long *)0x0) {
    IMutableContext::currentContext = (long *)operator_new(0x30);
    *IMutableContext::currentContext = 0;
    IMutableContext::currentContext[1] = 0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
    *IMutableContext::currentContext = (long)&PTR__Context_0019cd20;
    IMutableContext::currentContext[1] = (long)&PTR__Context_0019cd70;
  }
  plVar1 = (long *)(**(code **)(*IMutableContext::currentContext + 0x10))();
  sVar2 = strlen(__s);
  (**(code **)(*plVar1 + 0x48))(plVar1,__s,sVar2);
  raise(sig);
  return;
}

Assistant:

static void handleSignal( int sig ) {
        char const * name = "<unknown signal>";
        for (auto const& def : signalDefs) {
            if (sig == def.id) {
                name = def.name;
                break;
            }
        }
        // We need to restore previous signal handlers and let them do
        // their thing, so that the users can have the debugger break
        // when a signal is raised, and so on.
        restorePreviousSignalHandlers();
        reportFatal( name );
        raise( sig );
    }